

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_decoder.c
# Opt level: O0

lzma_ret lzma2_decode(void *coder_ptr,lzma_dict *dict,uint8_t *in,size_t *in_pos,size_t in_size)

{
  size_t sVar1;
  _Bool _Var2;
  uint uVar3;
  lzma_ret lVar4;
  bool bVar5;
  size_t in_used;
  lzma_ret ret;
  size_t in_start;
  uint32_t control;
  lzma_lzma2_coder *coder;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_dict *dict_local;
  void *coder_ptr_local;
  
  do {
    bVar5 = true;
    if (in_size <= *in_pos) {
      bVar5 = *coder_ptr == 6;
    }
    if (!bVar5) {
      return LZMA_OK;
    }
    switch(*coder_ptr) {
    case 0:
      uVar3 = (uint)in[*in_pos];
      *in_pos = *in_pos + 1;
      if (uVar3 == 0) {
        return LZMA_STREAM_END;
      }
      if ((uVar3 < 0xe0) && (uVar3 != 1)) {
        if ((*(byte *)((long)coder_ptr + 0x41) & 1) != 0) {
          return LZMA_DATA_ERROR;
        }
      }
      else {
        *(undefined1 *)((long)coder_ptr + 0x40) = 1;
        *(undefined1 *)((long)coder_ptr + 0x41) = 1;
      }
      if (uVar3 < 0x80) {
        if (2 < uVar3) {
          return LZMA_DATA_ERROR;
        }
        *(undefined4 *)coder_ptr = 3;
        *(undefined4 *)((long)coder_ptr + 4) = 7;
      }
      else {
        *(ulong *)((long)coder_ptr + 0x30) = (ulong)((uVar3 & 0x1f) << 0x10);
        *(undefined4 *)coder_ptr = 1;
        if (uVar3 < 0xc0) {
          if ((*(byte *)((long)coder_ptr + 0x40) & 1) != 0) {
            return LZMA_DATA_ERROR;
          }
          *(undefined4 *)((long)coder_ptr + 4) = 6;
          if (0x9f < uVar3) {
            (**(code **)((long)coder_ptr + 0x18))
                      (*(undefined8 *)((long)coder_ptr + 8),(long)coder_ptr + 0x48);
          }
        }
        else {
          *(undefined1 *)((long)coder_ptr + 0x40) = 0;
          *(undefined4 *)((long)coder_ptr + 4) = 5;
        }
      }
      if ((*(byte *)((long)coder_ptr + 0x41) & 1) != 0) {
        *(undefined1 *)((long)coder_ptr + 0x41) = 0;
        dict_reset(dict);
        return LZMA_OK;
      }
      break;
    case 1:
      sVar1 = *in_pos;
      *in_pos = sVar1 + 1;
      *(ulong *)((long)coder_ptr + 0x30) =
           (ulong)in[sVar1] * 0x100 + *(long *)((long)coder_ptr + 0x30);
      *(undefined4 *)coder_ptr = 2;
      break;
    case 2:
      sVar1 = *in_pos;
      *in_pos = sVar1 + 1;
      *(long *)((long)coder_ptr + 0x30) =
           (long)(int)(in[sVar1] + 1) + *(long *)((long)coder_ptr + 0x30);
      *(undefined4 *)coder_ptr = 3;
      (**(code **)((long)coder_ptr + 0x20))
                (*(undefined8 *)((long)coder_ptr + 8),*(undefined8 *)((long)coder_ptr + 0x30));
      break;
    case 3:
      sVar1 = *in_pos;
      *in_pos = sVar1 + 1;
      *(ulong *)((long)coder_ptr + 0x38) = (ulong)in[sVar1] << 8;
      *(undefined4 *)coder_ptr = 4;
      break;
    case 4:
      sVar1 = *in_pos;
      *in_pos = sVar1 + 1;
      *(long *)((long)coder_ptr + 0x38) =
           (long)(int)(in[sVar1] + 1) + *(long *)((long)coder_ptr + 0x38);
      *(undefined4 *)coder_ptr = *(undefined4 *)((long)coder_ptr + 4);
      break;
    case 5:
      sVar1 = *in_pos;
      *in_pos = sVar1 + 1;
      _Var2 = lzma_lzma_lclppb_decode((lzma_options_lzma *)((long)coder_ptr + 0x48),in[sVar1]);
      if (_Var2) {
        return LZMA_DATA_ERROR;
      }
      (**(code **)((long)coder_ptr + 0x18))
                (*(undefined8 *)((long)coder_ptr + 8),(long)coder_ptr + 0x48);
      *(undefined4 *)coder_ptr = 6;
      break;
    case 6:
      sVar1 = *in_pos;
      lVar4 = (**(code **)((long)coder_ptr + 0x10))
                        (*(undefined8 *)((long)coder_ptr + 8),dict,in,in_pos,in_size);
      if (*(ulong *)((long)coder_ptr + 0x38) < *in_pos - sVar1) {
        return LZMA_DATA_ERROR;
      }
      *(size_t *)((long)coder_ptr + 0x38) = *(long *)((long)coder_ptr + 0x38) - (*in_pos - sVar1);
      if (lVar4 != LZMA_STREAM_END) {
        return lVar4;
      }
      if (*(long *)((long)coder_ptr + 0x38) != 0) {
        return LZMA_DATA_ERROR;
      }
      *(undefined4 *)coder_ptr = 0;
      break;
    case 7:
      dict_write(dict,in,in_pos,in_size,(size_t *)((long)coder_ptr + 0x38));
      if (*(long *)((long)coder_ptr + 0x38) != 0) {
        return LZMA_OK;
      }
      *(undefined4 *)coder_ptr = 0;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_decoder.c"
                    ,0xcd,
                    "lzma_ret lzma2_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                   );
    }
  } while( true );
}

Assistant:

static lzma_ret
lzma2_decode(void *coder_ptr, lzma_dict *restrict dict,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size)
{
	lzma_lzma2_coder *restrict coder = coder_ptr;

	// With SEQ_LZMA it is possible that no new input is needed to do
	// some progress. The rest of the sequences assume that there is
	// at least one byte of input.
	while (*in_pos < in_size || coder->sequence == SEQ_LZMA)
	switch (coder->sequence) {
	case SEQ_CONTROL: {
		const uint32_t control = in[*in_pos];
		++*in_pos;

		// End marker
		if (control == 0x00)
			return LZMA_STREAM_END;

		if (control >= 0xE0 || control == 1) {
			// Dictionary reset implies that next LZMA chunk has
			// to set new properties.
			coder->need_properties = true;
			coder->need_dictionary_reset = true;
		} else if (coder->need_dictionary_reset) {
			return LZMA_DATA_ERROR;
		}

		if (control >= 0x80) {
			// LZMA chunk. The highest five bits of the
			// uncompressed size are taken from the control byte.
			coder->uncompressed_size = (control & 0x1F) << 16;
			coder->sequence = SEQ_UNCOMPRESSED_1;

			// See if there are new properties or if we need to
			// reset the state.
			if (control >= 0xC0) {
				// When there are new properties, state reset
				// is done at SEQ_PROPERTIES.
				coder->need_properties = false;
				coder->next_sequence = SEQ_PROPERTIES;

			} else if (coder->need_properties) {
				return LZMA_DATA_ERROR;

			} else {
				coder->next_sequence = SEQ_LZMA;

				// If only state reset is wanted with old
				// properties, do the resetting here for
				// simplicity.
				if (control >= 0xA0)
					coder->lzma.reset(coder->lzma.coder,
							&coder->options);
			}
		} else {
			// Invalid control values
			if (control > 2)
				return LZMA_DATA_ERROR;

			// It's uncompressed chunk
			coder->sequence = SEQ_COMPRESSED_0;
			coder->next_sequence = SEQ_COPY;
		}

		if (coder->need_dictionary_reset) {
			// Finish the dictionary reset and let the caller
			// flush the dictionary to the actual output buffer.
			coder->need_dictionary_reset = false;
			dict_reset(dict);
			return LZMA_OK;
		}

		break;
	}

	case SEQ_UNCOMPRESSED_1:
		coder->uncompressed_size += (uint32_t)(in[(*in_pos)++]) << 8;
		coder->sequence = SEQ_UNCOMPRESSED_2;
		break;

	case SEQ_UNCOMPRESSED_2:
		coder->uncompressed_size += in[(*in_pos)++] + 1;
		coder->sequence = SEQ_COMPRESSED_0;
		coder->lzma.set_uncompressed(coder->lzma.coder,
				coder->uncompressed_size);
		break;

	case SEQ_COMPRESSED_0:
		coder->compressed_size = (uint32_t)(in[(*in_pos)++]) << 8;
		coder->sequence = SEQ_COMPRESSED_1;
		break;

	case SEQ_COMPRESSED_1:
		coder->compressed_size += in[(*in_pos)++] + 1;
		coder->sequence = coder->next_sequence;
		break;

	case SEQ_PROPERTIES:
		if (lzma_lzma_lclppb_decode(&coder->options, in[(*in_pos)++]))
			return LZMA_DATA_ERROR;

		coder->lzma.reset(coder->lzma.coder, &coder->options);

		coder->sequence = SEQ_LZMA;
		break;

	case SEQ_LZMA: {
		// Store the start offset so that we can update
		// coder->compressed_size later.
		const size_t in_start = *in_pos;

		// Decode from in[] to *dict.
		const lzma_ret ret = coder->lzma.code(coder->lzma.coder,
				dict, in, in_pos, in_size);

		// Validate and update coder->compressed_size.
		const size_t in_used = *in_pos - in_start;
		if (in_used > coder->compressed_size)
			return LZMA_DATA_ERROR;

		coder->compressed_size -= in_used;

		// Return if we didn't finish the chunk, or an error occurred.
		if (ret != LZMA_STREAM_END)
			return ret;

		// The LZMA decoder must have consumed the whole chunk now.
		// We don't need to worry about uncompressed size since it
		// is checked by the LZMA decoder.
		if (coder->compressed_size != 0)
			return LZMA_DATA_ERROR;

		coder->sequence = SEQ_CONTROL;
		break;
	}

	case SEQ_COPY: {
		// Copy from input to the dictionary as is.
		dict_write(dict, in, in_pos, in_size, &coder->compressed_size);
		if (coder->compressed_size != 0)
			return LZMA_OK;

		coder->sequence = SEQ_CONTROL;
		break;
	}

	default:
		assert(0);
		return LZMA_PROG_ERROR;
	}

	return LZMA_OK;
}